

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void update_nst(int (*array) [8] [5] [5] [5] [5])

{
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int max6;
  int max5;
  int max4;
  int max3;
  int max2;
  int max;
  int n;
  int m;
  int l;
  int k;
  int j;
  int i;
  int (*array_local) [8] [5] [5] [5] [5];
  
  for (k = 1; k < 7; k = k + 1) {
    for (l = 1; l < 7; l = l + 1) {
      for (m = 1; m < 5; m = m + 1) {
        for (n = 1; n < 5; n = n + 1) {
          for (max = 1; max < 5; max = max + 1) {
            max6 = -10000000;
            max5 = -10000000;
            max4 = -10000000;
            max3 = -10000000;
            for (max2 = 1; max2 < 5; max2 = max2 + 1) {
              if (array[k][l][m][n][max][max2] < max3) {
                local_44 = max3;
              }
              else {
                local_44 = array[k][l][m][n][max][max2];
              }
              max3 = local_44;
              if (array[k][l][m][n][max2][max] < max4) {
                local_48 = max4;
              }
              else {
                local_48 = array[k][l][m][n][max2][max];
              }
              max4 = local_48;
              if (array[k][l][m][max2][n][max] < max5) {
                local_4c = max5;
              }
              else {
                local_4c = array[k][l][m][max2][n][max];
              }
              max5 = local_4c;
              if (array[k][l][max2][m][n][max] < max6) {
                local_50 = max6;
              }
              else {
                local_50 = array[k][l][max2][m][n][max];
              }
              max6 = local_50;
            }
            array[k][l][m][n][max][0] = max3;
            array[k][l][m][n][0][max] = max4;
            array[k][l][m][0][n][max] = max5;
            array[k][l][0][m][n][max] = max6;
          }
        }
      }
    }
  }
  for (k = 1; k < 7; k = k + 1) {
    for (l = 1; l < 7; l = l + 1) {
      for (m = 1; m < 5; m = m + 1) {
        for (n = 1; n < 5; n = n + 1) {
          local_40 = -10000000;
          local_3c = -10000000;
          max6 = -10000000;
          max5 = -10000000;
          max4 = -10000000;
          max3 = -10000000;
          for (max = 1; max < 5; max = max + 1) {
            if (array[k][l][m][n][max][0] < max3) {
              local_54 = max3;
            }
            else {
              local_54 = array[k][l][m][n][max][0];
            }
            max3 = local_54;
            if (array[k][l][m][max][0][n] < max4) {
              local_58 = max4;
            }
            else {
              local_58 = array[k][l][m][max][0][n];
            }
            max4 = local_58;
            if (array[k][l][max][0][m][n] < max5) {
              local_5c = max5;
            }
            else {
              local_5c = array[k][l][max][0][m][n];
            }
            max5 = local_5c;
            if (array[k][l][0][m][n][max] < max6) {
              local_60 = max6;
            }
            else {
              local_60 = array[k][l][0][m][n][max];
            }
            max6 = local_60;
            if (array[k][l][0][m][max][n] < local_3c) {
              local_64 = local_3c;
            }
            else {
              local_64 = array[k][l][0][m][max][n];
            }
            local_3c = local_64;
            if (array[k][l][m][0][n][max] < local_40) {
              local_68 = local_40;
            }
            else {
              local_68 = array[k][l][m][0][n][max];
            }
            local_40 = local_68;
          }
          array[k][l][m][n][0][0] = max3;
          array[k][l][m][0][0][n] = max4;
          array[k][l][0][0][m][n] = max5;
          array[k][l][m][0][n][0] = local_40;
          array[k][l][0][m][0][n] = local_3c;
          array[k][l][0][m][n][0] = max6;
        }
      }
    }
  }
  for (k = 1; k < 7; k = k + 1) {
    for (l = 1; l < 7; l = l + 1) {
      for (m = 1; m < 5; m = m + 1) {
        max6 = -10000000;
        max5 = -10000000;
        max4 = -10000000;
        max3 = -10000000;
        for (n = 1; n < 5; n = n + 1) {
          if (array[k][l][m][n][0][0] < max3) {
            local_6c = max3;
          }
          else {
            local_6c = array[k][l][m][n][0][0];
          }
          max3 = local_6c;
          if (array[k][l][0][m][n][0] < max4) {
            local_70 = max4;
          }
          else {
            local_70 = array[k][l][0][m][n][0];
          }
          max4 = local_70;
          if (array[k][l][0][0][m][n] < max5) {
            local_74 = max5;
          }
          else {
            local_74 = array[k][l][0][0][m][n];
          }
          max5 = local_74;
          if (array[k][l][0][0][n][m] < max6) {
            local_78 = max6;
          }
          else {
            local_78 = array[k][l][0][0][n][m];
          }
          max6 = local_78;
        }
        array[k][l][m][0][0][0] = max3;
        array[k][l][0][m][0][0] = max4;
        array[k][l][0][0][m][0] = max5;
        array[k][l][0][0][0][m] = max6;
      }
    }
  }
  for (k = 1; k < 7; k = k + 1) {
    for (l = 1; l < 7; l = l + 1) {
      max3 = -10000000;
      for (m = 1; m < 5; m = m + 1) {
        if (array[k][l][m][0][0][0] < max3) {
          local_7c = max3;
        }
        else {
          local_7c = array[k][l][m][0][0][0];
        }
        max3 = local_7c;
      }
      array[k][l][0][0][0][0] = max3;
    }
  }
  for (k = 1; k < 7; k = k + 1) {
    for (m = 0; m < 5; m = m + 1) {
      for (n = 0; n < 5; n = n + 1) {
        for (max = 0; max < 5; max = max + 1) {
          for (max2 = 0; max2 < 5; max2 = max2 + 1) {
            max4 = -10000000;
            max3 = -10000000;
            for (l = 1; l < 7; l = l + 1) {
              if (array[k][l][m][n][max][max2] < max3) {
                local_80 = max3;
              }
              else {
                local_80 = array[k][l][m][n][max][max2];
              }
              max3 = local_80;
              if (array[l][k][m][n][max][max2] < max4) {
                local_84 = max4;
              }
              else {
                local_84 = array[l][k][m][n][max][max2];
              }
              max4 = local_84;
            }
            array[k][7][m][n][max][max2] = max3;
            array[7][k][m][n][max][max2] = max4;
          }
        }
      }
    }
  }
  for (m = 0; m < 5; m = m + 1) {
    for (n = 0; n < 5; n = n + 1) {
      for (max = 0; max < 5; max = max + 1) {
        for (max2 = 0; max2 < 5; max2 = max2 + 1) {
          max3 = -10000000;
          for (l = 1; l < 7; l = l + 1) {
            if (array[7][l][m][n][max][max2] < max3) {
              local_88 = max3;
            }
            else {
              local_88 = array[7][l][m][n][max][max2];
            }
            max3 = local_88;
          }
          array[7][7][m][n][max][max2] = max3;
        }
      }
    }
  }
  return;
}

Assistant:

PRIVATE void
update_nst(int array[NBPAIRS + 1][NBPAIRS + 1][5][5][5][5])
{
  int i, j, k, l, m, n;
  int max, max2, max3, max4, max5, max6;

  /* get maxima for one nonstandard nucleotide */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      for (k = 1; k < 5; k++) {
        for (l = 1; l < 5; l++) {
          for (m = 1; m < 5; m++) {
            max = max2 = max3 = max4 = -INF; /* max of {CGAU} */
            for (n = 1; n < 5; n++) {
              max   = MAX2(max, array[i][j][k][l][m][n]);
              max2  = MAX2(max2, array[i][j][k][l][n][m]);
              max3  = MAX2(max3, array[i][j][k][n][l][m]);
              max4  = MAX2(max4, array[i][j][n][k][l][m]);
            }
            array[i][j][k][l][m][0] = max;
            array[i][j][k][l][0][m] = max2;
            array[i][j][k][0][l][m] = max3;
            array[i][j][0][k][l][m] = max4;
          }
        }
      }
    }
  }
  /* get maxima for two nonstandard nucleotides */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      for (k = 1; k < 5; k++) {
        for (l = 1; l < 5; l++) {
          max = max2 = max3 = max4 = max5 = max6 = -INF; /* max of {CGAU} */
          for (m = 1; m < 5; m++) {
            max   = MAX2(max, array[i][j][k][l][m][0]);
            max2  = MAX2(max2, array[i][j][k][m][0][l]);
            max3  = MAX2(max3, array[i][j][m][0][k][l]);
            max4  = MAX2(max4, array[i][j][0][k][l][m]);
            max5  = MAX2(max5, array[i][j][0][k][m][l]);
            max6  = MAX2(max6, array[i][j][k][0][l][m]);
          }
          array[i][j][k][l][0][0] = max;
          array[i][j][k][0][0][l] = max2;
          array[i][j][0][0][k][l] = max3;
          array[i][j][k][0][l][0] = max6;
          array[i][j][0][k][0][l] = max5;
          array[i][j][0][k][l][0] = max4;
        }
      }
    }
  }
  /* get maxima for three nonstandard nucleotides */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      for (k = 1; k < 5; k++) {
        max = max2 = max3 = max4 = -INF; /* max of {CGAU} */
        for (l = 1; l < 5; l++) {
          /* should be arbitrary where index l resides in last 3 possible locations */
          max   = MAX2(max, array[i][j][k][l][0][0]);
          max2  = MAX2(max2, array[i][j][0][k][l][0]);
          max3  = MAX2(max3, array[i][j][0][0][k][l]);
          max4  = MAX2(max4, array[i][j][0][0][l][k]);
        }
        array[i][j][k][0][0][0] = max;
        array[i][j][0][k][0][0] = max2;
        array[i][j][0][0][k][0] = max3;
        array[i][j][0][0][0][k] = max4;
      }
    }
  }
  /* get maxima for 4 nonstandard nucleotides */
  for (i = 1; i < NBPAIRS; i++) {
    for (j = 1; j < NBPAIRS; j++) {
      max = -INF; /* max of {CGAU} */
      for (k = 1; k < 5; k++)
        max = MAX2(max, array[i][j][k][0][0][0]);
      array[i][j][0][0][0][0] = max;
    }
  }

  /*
   * now compute contributions for nonstandard base pairs ...
   * first, 1 nonstandard bp
   */
  for (i = 1; i < NBPAIRS; i++) {
    for (k = 0; k < 5; k++) {
      for (l = 0; l < 5; l++) {
        for (m = 0; m < 5; m++) {
          for (n = 0; n < 5; n++) {
            max = max2 = -INF;
            for (j = 1; j < NBPAIRS; j++) {
              max   = MAX2(max, array[i][j][k][l][m][n]);
              max2  = MAX2(max2, array[j][i][k][l][m][n]);
            }
            array[i][NBPAIRS][k][l][m][n] = max;
            array[NBPAIRS][i][k][l][m][n] = max2;
          }
        }
      }
    }
  }

  /* now 2 nst base pairs */
  for (k = 0; k < 5; k++) {
    for (l = 0; l < 5; l++) {
      for (m = 0; m < 5; m++) {
        for (n = 0; n < 5; n++) {
          max = -INF;
          for (j = 1; j < NBPAIRS; j++)
            max = MAX2(max, array[NBPAIRS][j][k][l][m][n]);
          array[NBPAIRS][NBPAIRS][k][l][m][n] = max;
        }
      }
    }
  }
}